

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O2

CURLcode socks_proxy_cf_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  uchar *puVar1;
  byte bVar2;
  connectdata *conn;
  connectdata *pcVar3;
  sockaddr *psVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  _Bool _Var8;
  ushort uVar9;
  CURLcode CVar10;
  uint uVar11;
  int iVar12;
  resolve_t rVar13;
  CURLproxycode CVar14;
  socks_state *sx;
  size_t sVar15;
  size_t __n;
  ulong uVar16;
  long lVar17;
  uchar uVar18;
  long lVar19;
  connect_t cVar20;
  ulong uVar21;
  Curl_addrinfo *pCVar22;
  char *pcVar23;
  char *pcVar24;
  Curl_dns_entry *pCVar25;
  ssize_t sVar26;
  Curl_dns_entry *dns;
  ulong local_a8;
  size_t local_a0;
  connectdata *local_98;
  uchar ip4 [4];
  char dest [46];
  
  if ((cf->field_0x24 & 1) != 0) {
    CVar10 = CURLE_OK;
    _Var8 = true;
    goto LAB_005d7bc7;
  }
  sx = (socks_state *)cf->ctx;
  conn = cf->conn;
  iVar12 = cf->sockindex;
  CVar10 = (*cf->next->cft->do_connect)(cf->next,data,blocking,done);
  if (CVar10 != CURLE_OK) {
    return CVar10;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  if (sx == (socks_state *)0x0) {
    sx = (socks_state *)(*Curl_ccalloc)(1,0x290);
    if (sx == (socks_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    cf->ctx = sx;
  }
  cVar20 = sx->state;
  if (cVar20 == CONNECT_INIT) {
    sx->state = CONNECT_SOCKS_INIT;
    lVar17 = 0xd8;
    if ((((uint)conn->bits & 1) == 0) && (lVar17 = 0x80, ((uint)conn->bits >> 9 & 1) == 0)) {
      lVar17 = 0x50;
      if (iVar12 == 1) {
        lVar17 = 0x68;
      }
    }
    sx->hostname = *(char **)((long)&(conn->bundle_node).ptr + lVar17);
    if (((uint)conn->bits & 1) == 0) {
      if (iVar12 == 1) {
        uVar11 = (uint)conn->secondary_port;
      }
      else if (((uint)conn->bits >> 10 & 1) == 0) {
        uVar11 = conn->remote_port;
      }
      else {
        uVar11 = conn->conn_to_port;
      }
    }
    else {
      uVar11 = (conn->http_proxy).port;
    }
    sx->remote_port = uVar11;
    uVar5 = *(undefined4 *)((long)&(conn->socks_proxy).user + 4);
    uVar6 = *(undefined4 *)&(conn->socks_proxy).passwd;
    uVar7 = *(undefined4 *)((long)&(conn->socks_proxy).passwd + 4);
    *(undefined4 *)&sx->proxy_user = *(undefined4 *)&(conn->socks_proxy).user;
    *(undefined4 *)((long)&sx->proxy_user + 4) = uVar5;
    *(undefined4 *)&sx->proxy_password = uVar6;
    *(undefined4 *)((long)&sx->proxy_password + 4) = uVar7;
    cVar20 = CONNECT_SOCKS_INIT;
  }
  pcVar3 = cf->conn;
  bVar2 = (pcVar3->socks_proxy).proxytype;
  local_a8 = (ulong)bVar2;
  switch(bVar2) {
  case 4:
  case 6:
    break;
  case 5:
  case 7:
    pcVar24 = sx->hostname;
    local_98 = pcVar3;
    sVar15 = strlen(pcVar24);
    bVar2 = (data->set).socks5auth;
    dns = (Curl_dns_entry *)0x0;
    if (cVar20 - CONNECT_SOCKS_INIT < 0x10) {
      puVar1 = sx->buffer;
      switch(cVar20) {
      case CONNECT_SOCKS_INIT:
        if ((((uint)local_98->bits & 1) != 0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(data,"SOCKS5: connecting to HTTP proxy %s port %d",pcVar24);
        }
        if (((char)local_a8 == '\x05') || (sVar15 < 0x100)) {
          if (((bVar2 & 0xfa) != 0) && (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data,"warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %u",
                       (ulong)bVar2);
          }
          if ((bVar2 & 1) == 0) {
            sx->proxy_user = (char *)0x0;
            sx->buffer[0] = '\x05';
            sVar26 = 3;
            lVar17 = 0x12;
            uVar18 = '\0';
LAB_005d8312:
            sx->buffer[lVar17 + -0x10] = uVar18;
          }
          else {
            pcVar24 = sx->proxy_user;
            sx->buffer[0] = '\x05';
            sx->buffer[2] = '\0';
            if (pcVar24 != (char *)0x0) {
              sVar26 = 4;
              uVar18 = '\x02';
              lVar17 = 0x13;
              goto LAB_005d8312;
            }
            sVar26 = 3;
          }
          sx->buffer[1] = (char)sVar26 + 0xfe;
          sx->outp = puVar1;
          sx->outstanding = sVar26;
          CVar14 = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
          if (CVar14 != CURLPX_OK) goto LAB_005d8ba3;
          if (sx->outstanding != 0) goto LAB_005d8b87;
          if (sx->state != CONNECT_SOCKS_READ) {
            sx->state = CONNECT_SOCKS_READ;
          }
          goto switchD_005d7d06_caseD_3;
        }
        pcVar24 = 
        "SOCKS5: the destination hostname is too long to be resolved remotely by the proxy.";
LAB_005d81ea:
        Curl_failf(data,pcVar24);
        CVar14 = CURLPX_LONG_HOSTNAME;
        goto LAB_005d8ba3;
      case CONNECT_SOCKS_SEND:
        CVar14 = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
        if (CVar14 != CURLPX_OK) goto LAB_005d8ba3;
        if (sx->outstanding == 0) goto switchD_005d7d06_caseD_3;
        goto LAB_005d8b87;
      case CONNECT_SOCKS_READ_INIT:
switchD_005d7d06_caseD_3:
        sx->outstanding = 2;
        sx->outp = puVar1;
        break;
      case CONNECT_GSSAPI_INIT:
        goto switchD_005d7d06_caseD_5;
      case CONNECT_AUTH_INIT:
        goto switchD_005d7d06_caseD_6;
      case CONNECT_AUTH_SEND:
        goto switchD_005d7d06_caseD_7;
      case CONNECT_AUTH_READ:
        goto switchD_005d7d06_caseD_8;
      case CONNECT_REQ_INIT:
        goto switchD_005d7d06_caseD_9;
      case CONNECT_RESOLVING:
        CVar14 = CURLPX_RESOLVE_HOST;
        dns = Curl_fetch_addr(data,pcVar24,sx->remote_port);
        if (dns != (Curl_dns_entry *)0x0) {
          if (((data->set).field_0x8bd & 0x10) != 0) {
            Curl_infof(data,"SOCKS5: hostname \'%s\' found",sx->hostname);
          }
          goto LAB_005d8869;
        }
        CVar10 = Curl_resolv_check(data,&dns);
        if (dns == (Curl_dns_entry *)0x0) {
          if (CVar10 == CURLE_OK) {
            CVar14 = CURLPX_OK;
          }
          goto LAB_005d8ba3;
        }
        goto LAB_005d8875;
      case CONNECT_RESOLVED:
        goto switchD_005d7d06_caseD_b;
      case CONNECT_RESOLVE_REMOTE:
        sx->buffer[0] = '\x05';
        sx->buffer[1] = '\x01';
        sx->buffer[2] = '\0';
        if ((char)local_a8 == '\x05') {
          lVar17 = 3;
          goto LAB_005d89bb;
        }
        goto LAB_005d874a;
      case CONNECT_REQ_SEND:
        lVar17 = 0;
        goto LAB_005d89bb;
      case CONNECT_REQ_SENDING:
        goto switchD_005d7d06_caseD_e;
      case CONNECT_REQ_READ:
        goto switchD_005d7d06_caseD_f;
      case CONNECT_REQ_READ_MORE:
        goto switchD_005d7d06_caseD_10;
      }
      CVar14 = socks_state_recv(cf,sx,data,CURLPX_RECV_CONNECT,"initial SOCKS5 response");
      if (CVar14 != CURLPX_OK) goto LAB_005d8ba3;
      if (sx->outstanding != 0) goto LAB_005d8b87;
      if (*puVar1 != '\x05') {
        pcVar24 = "Received invalid version in initial SOCKS5 response.";
        goto LAB_005d81c0;
      }
      uVar18 = sx->buffer[1];
      if (uVar18 == 0xff) {
        Curl_failf(data,"No authentication method was acceptable.");
        CVar14 = CURLPX_NO_AUTH;
      }
      else if (uVar18 == '\x01') {
        Curl_failf(data,"SOCKS5 GSSAPI per-message authentication is not supported.");
        CVar14 = CURLPX_GSSAPI_PERMSG;
      }
      else if (uVar18 == '\x02') {
        if (sx->state != CONNECT_AUTH_INIT) {
          sx->state = CONNECT_AUTH_INIT;
        }
switchD_005d7d06_caseD_6:
        pcVar24 = sx->proxy_user;
        if ((pcVar24 == (char *)0x0) || (pcVar23 = sx->proxy_password, pcVar23 == (char *)0x0)) {
          uVar16 = 0;
          __n = 0;
        }
        else {
          local_a0 = sVar15;
          __n = strlen(pcVar24);
          uVar16 = strlen(pcVar23);
          sVar15 = local_a0;
        }
        sx->buffer[0] = '\x01';
        sx->buffer[1] = (uchar)__n;
        if (__n != 0 && pcVar24 != (char *)0x0) {
          if (0xff < __n) {
            pcVar24 = "Excessive user name length for proxy auth";
            goto LAB_005d81d5;
          }
          local_a0 = uVar16;
          memcpy(sx->buffer + 2,pcVar24,__n);
          uVar16 = local_a0;
        }
        sx->buffer[__n + 2] = (uchar)uVar16;
        if (uVar16 != 0 && sx->proxy_password != (char *)0x0) {
          if (0xff < uVar16) {
            CVar14 = CURLPX_LONG_PASSWD;
            Curl_failf(data,"Excessive password length for proxy auth");
            goto LAB_005d8ba3;
          }
          local_a0 = uVar16;
          memcpy(puVar1 + __n + 3,sx->proxy_password,uVar16);
          uVar16 = local_a0;
        }
        if (sx->state != CONNECT_AUTH_SEND) {
          sx->state = CONNECT_AUTH_SEND;
        }
        sx->outstanding = __n + 3 + uVar16;
        sx->outp = puVar1;
switchD_005d7d06_caseD_7:
        CVar14 = socks_state_send(cf,sx,data,CURLPX_SEND_AUTH,"SOCKS5 sub-negotiation request");
        if (CVar14 == CURLPX_OK) {
          if (sx->outstanding != 0) goto LAB_005d8b87;
          sx->outp = puVar1;
          sx->outstanding = 2;
          if (sx->state != CONNECT_AUTH_READ) {
            sx->state = CONNECT_AUTH_READ;
          }
switchD_005d7d06_caseD_8:
          CVar14 = socks_state_recv(cf,sx,data,CURLPX_RECV_AUTH,"SOCKS5 sub-negotiation response");
          if (CVar14 == CURLPX_OK) {
            if (sx->outstanding != 0) goto LAB_005d8b87;
            if (sx->buffer[1] == '\0') goto LAB_005d8723;
            Curl_failf(data,"User was rejected by the SOCKS5 server (%d %d).",(ulong)*puVar1);
            CVar14 = CURLPX_USER_REJECTED;
          }
        }
      }
      else {
        if (uVar18 != '\0') {
          Curl_failf(data,"Undocumented SOCKS5 mode attempted to be used by server.");
          CVar14 = CURLPX_UNKNOWN_MODE;
          goto LAB_005d8ba3;
        }
LAB_005d8723:
        if (sx->state != CONNECT_REQ_INIT) {
          sx->state = CONNECT_REQ_INIT;
        }
switchD_005d7d06_caseD_9:
        CVar14 = CURLPX_RESOLVE_HOST;
        if ((char)local_a8 == '\x05') {
          rVar13 = Curl_resolv(data,sx->hostname,sx->remote_port,true,&dns);
          if (rVar13 != CURLRESOLV_ERROR) {
            if (rVar13 != CURLRESOLV_PENDING) {
              if (sx->state != CONNECT_RESOLVED) {
                sx->state = CONNECT_RESOLVED;
              }
LAB_005d8869:
              if (dns == (Curl_dns_entry *)0x0) {
switchD_005d7d06_caseD_b:
                pCVar22 = (Curl_addrinfo *)0x0;
              }
              else {
LAB_005d8875:
                pCVar22 = dns->addr;
              }
              CVar14 = CURLPX_RESOLVE_HOST;
              uVar18 = (data->set).ipver;
              if (uVar18 != '\0') {
                for (; pCVar22 != (Curl_addrinfo *)0x0; pCVar22 = pCVar22->ai_next) {
                  if (pCVar22->ai_family == (uint)(uVar18 != '\x01') * 8 + 2) goto LAB_005d88aa;
                }
LAB_005d88fa:
                Curl_failf(data,"Failed to resolve \"%s\" for SOCKS5 connect.",sx->hostname);
                goto LAB_005d8ba3;
              }
              if (pCVar22 == (Curl_addrinfo *)0x0) goto LAB_005d88fa;
LAB_005d88aa:
              Curl_printable_address(pCVar22,dest,0x2e);
              sx->buffer[0] = '\x05';
              sx->buffer[1] = '\x01';
              sx->buffer[2] = '\0';
              if (pCVar22->ai_family == 10) {
                lVar17 = 0x14;
                sx->buffer[3] = '\x04';
                psVar4 = pCVar22->ai_addr;
                for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 1) {
                  sx->buffer[lVar19 + 4] = psVar4->sa_data[lVar19 + 6];
                }
                if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
                  uVar11 = sx->remote_port;
                  pcVar24 = "SOCKS5 connect to [%s]:%d (locally resolved)";
LAB_005d897f:
                  Curl_infof(data,pcVar24,dest,(ulong)uVar11);
                }
              }
              else if (pCVar22->ai_family == 2) {
                lVar17 = 8;
                sx->buffer[3] = '\x01';
                psVar4 = pCVar22->ai_addr;
                for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
                  sx->buffer[lVar19 + 4] = psVar4->sa_data[lVar19 + 2];
                }
                if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
                  uVar11 = sx->remote_port;
                  pcVar24 = "SOCKS5 connect to %s:%d (locally resolved)";
                  goto LAB_005d897f;
                }
              }
              else {
                Curl_failf(data,"SOCKS5 connection to %s not supported",dest);
                lVar17 = 3;
              }
              Curl_resolv_unlock(data,dns);
              goto LAB_005d89bb;
            }
            CVar14 = CURLPX_OK;
            if (sx->state != CONNECT_RESOLVING) {
              sx->state = CONNECT_RESOLVING;
            }
          }
        }
        else {
          sx->buffer[0] = '\x05';
          sx->buffer[1] = '\x01';
          sx->buffer[2] = '\0';
LAB_005d874a:
          if (((local_98->bits).field_0x1 & 8) == 0) {
            iVar12 = inet_pton(2,sx->hostname,ip4);
            if (iVar12 == 1) {
              sx->buffer[3] = '\x01';
              *(uchar (*) [4])(sx->buffer + 4) = ip4;
              lVar17 = 8;
            }
            else {
              sx->buffer[3] = '\x03';
              sx->buffer[4] = (uchar)sVar15;
              memcpy(sx->buffer + 5,sx->hostname,sVar15);
              lVar17 = sVar15 + 5;
            }
LAB_005d8828:
            if (((data->set).field_0x8bd & 0x10) != 0) {
              Curl_infof(data,"SOCKS5 connect to %s:%d (remotely resolved)",sx->hostname,
                         (ulong)(uint)sx->remote_port);
            }
LAB_005d89bb:
            sx->buffer[lVar17] = *(uchar *)((long)&sx->remote_port + 1);
            sx->buffer[lVar17 + 1] = (uchar)sx->remote_port;
            sx->outp = puVar1;
            sx->outstanding = lVar17 + 2;
            if (sx->state != CONNECT_REQ_SENDING) {
              sx->state = CONNECT_REQ_SENDING;
            }
switchD_005d7d06_caseD_e:
            CVar14 = socks_state_send(cf,sx,data,CURLPX_SEND_REQUEST,"SOCKS5 connect request");
            if (CVar14 == CURLPX_OK) {
              if (sx->outstanding == 0) {
                sx->outstanding = 10;
                sx->outp = puVar1;
                if (sx->state != CONNECT_REQ_READ) {
                  sx->state = CONNECT_REQ_READ;
                }
switchD_005d7d06_caseD_f:
                CVar14 = socks_state_recv(cf,sx,data,CURLPX_RECV_REQACK,"SOCKS5 connect request ack"
                                         );
                if (CVar14 != CURLPX_OK) goto LAB_005d8ba3;
                if (sx->outstanding == 0) {
                  if (*puVar1 != '\x05') {
                    pcVar24 = "SOCKS5 reply has wrong version, version should be 5.";
                    goto LAB_005d81c0;
                  }
                  bVar2 = sx->buffer[1];
                  if (bVar2 != 0) {
                    Curl_failf(data,"Can\'t complete SOCKS5 connection to %s. (%d)",sx->hostname,
                               (ulong)bVar2);
                    if (bVar2 < 9) {
                      CVar14 = *(CURLproxycode *)(do_SOCKS5_lookup + (ulong)bVar2 * 4);
                    }
                    else {
                      CVar14 = CURLPX_REPLY_UNASSIGNED;
                    }
                    goto LAB_005d8ba3;
                  }
                  uVar18 = sx->buffer[3];
                  if (uVar18 != '\x01') {
                    if (uVar18 == '\x03') {
                      if ((ulong)sx->buffer[4] < 4) goto LAB_005d8b4d;
                      lVar17 = (ulong)sx->buffer[4] + 7;
                    }
                    else {
                      if (uVar18 != '\x04') {
                        Curl_failf(data,"SOCKS5 reply has wrong address type.");
                        goto LAB_005d8b9d;
                      }
                      lVar17 = 0x16;
                    }
                    sx->outstanding = lVar17 + -10;
                    sx->outp = sx->buffer + 10;
                    if (sx->state != CONNECT_REQ_READ_MORE) {
                      sx->state = CONNECT_REQ_READ_MORE;
                    }
switchD_005d7d06_caseD_10:
                    CVar14 = socks_state_recv(cf,sx,data,CURLPX_RECV_ADDRESS,
                                              "SOCKS5 connect request address");
                    if (CVar14 != CURLPX_OK) goto LAB_005d8ba3;
                    if (sx->outstanding != 0) goto LAB_005d8b87;
                  }
LAB_005d8b4d:
                  if (sx->state != CONNECT_DONE) {
                    sx->state = CONNECT_DONE;
                  }
                  if (data != (Curl_easy *)0x0) goto switchD_005d7d06_caseD_5;
                }
              }
LAB_005d8b87:
              CVar14 = CURLPX_OK;
            }
          }
          else {
            iVar12 = inet_pton(10,sx->hostname,dest);
            if (iVar12 == 1) {
              sx->buffer[3] = '\x04';
              *(undefined8 *)(sx->buffer + 4) = dest._0_8_;
              *(undefined8 *)(sx->buffer + 0xc) = dest._8_8_;
              lVar17 = 0x14;
              goto LAB_005d8828;
            }
LAB_005d8b9d:
            CVar14 = CURLPX_BAD_ADDRESS_TYPE;
          }
        }
      }
    }
    else {
switchD_005d7d06_caseD_5:
      CVar14 = CURLPX_OK;
      if (((data->set).field_0x8bd & 0x10) != 0) {
        CVar14 = CURLPX_OK;
        Curl_infof(data,"SOCKS5 request granted.");
      }
    }
    goto LAB_005d8ba3;
  default:
    Curl_failf(data,"unknown proxytype option given");
    CVar10 = CURLE_COULDNT_CONNECT;
    goto LAB_005d8bb2;
  }
  dns = (Curl_dns_entry *)0x0;
  puVar1 = sx->buffer;
  switch(cVar20) {
  case CONNECT_SOCKS_INIT:
    pcVar3->ip_version = '\x01';
    if ((data == (Curl_easy *)0x0) || (((uint)pcVar3->bits & 1) == 0)) {
      if (data != (Curl_easy *)0x0) goto LAB_005d7e0f;
    }
    else {
      if (((data->set).field_0x8bd & 0x10) != 0) {
        pcVar24 = "";
        if (bVar2 == 6) {
          pcVar24 = "a";
        }
        Curl_infof(data,"SOCKS4%s: connecting to HTTP proxy %s port %d",pcVar24,sx->hostname,
                   (ulong)(uint)sx->remote_port);
      }
LAB_005d7e0f:
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data,"SOCKS4 communication to %s:%d",sx->hostname,(ulong)(uint)sx->remote_port);
      }
    }
    iVar12 = sx->remote_port;
    uVar9 = (ushort)iVar12;
    sx->buffer[0] = '\x04';
    sx->buffer[1] = '\x01';
    *(ushort *)(sx->buffer + 2) = uVar9 << 8 | uVar9 >> 8;
    if (bVar2 == 6) {
      if (sx->state != CONNECT_REQ_INIT) {
        sx->state = CONNECT_REQ_INIT;
      }
      goto switchD_005d7c4f_caseD_9;
    }
    rVar13 = Curl_resolv(data,sx->hostname,iVar12,true,&dns);
    if (rVar13 != CURLRESOLV_ERROR) {
      if (rVar13 != CURLRESOLV_PENDING) goto LAB_005d7ed0;
      if (sx->state != CONNECT_RESOLVING) {
        sx->state = CONNECT_RESOLVING;
      }
      CVar14 = CURLPX_OK;
      if ((data == (Curl_easy *)0x0) || (((data->set).field_0x8bd & 0x10) == 0)) break;
      pcVar24 = sx->hostname;
      pcVar23 = "SOCKS4 non-blocking resolve of %s";
LAB_005d8257:
      CVar14 = CURLPX_OK;
      Curl_infof(data,pcVar23,pcVar24);
      break;
    }
    goto LAB_005d7fff;
  default:
switchD_005d7c4f_caseD_2:
    if (*puVar1 == '\0') {
      switch(sx->buffer[1]) {
      case 'Z':
        CVar14 = CURLPX_OK;
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          pcVar24 = "";
          if ((char)local_a8 == '\x06') {
            pcVar24 = "a";
          }
          pcVar23 = "SOCKS4%s request granted.";
          goto LAB_005d8257;
        }
        break;
      case '[':
        Curl_failf(data,
                   "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed."
                   ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                   (ulong)sx->buffer[7],
                   (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                  *(ushort *)(sx->buffer + 2) >> 8),0x5b);
        CVar14 = CURLPX_REQUEST_FAILED;
        break;
      case '\\':
        Curl_failf(data,
                   "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
                   ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                   (ulong)sx->buffer[7],
                   (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                  *(ushort *)(sx->buffer + 2) >> 8),0x5c);
        CVar14 = CURLPX_IDENTD;
        break;
      case ']':
        Curl_failf(data,
                   "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
                   ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                   (ulong)sx->buffer[7],
                   (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                  *(ushort *)(sx->buffer + 2) >> 8),0x5d);
        CVar14 = CURLPX_IDENTD_DIFFER;
        break;
      default:
        Curl_failf(data,"Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.",
                   (ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                   (ulong)sx->buffer[7],
                   (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                  *(ushort *)(sx->buffer + 2) >> 8),(ulong)sx->buffer[1]);
        CVar14 = CURLPX_UNKNOWN_FAIL;
      }
      break;
    }
    pcVar24 = "SOCKS4 reply has wrong version, version should be 0.";
LAB_005d81c0:
    Curl_failf(data,pcVar24);
    CVar14 = CURLPX_BAD_VERSION;
    break;
  case CONNECT_SOCKS_READ:
switchD_005d7c4f_caseD_4:
    CVar14 = socks_state_recv(cf,sx,data,CURLPX_RECV_CONNECT,"connect request ack");
    if (CVar14 == CURLPX_OK) {
      if (sx->outstanding != 0) goto LAB_005d8b87;
      if (sx->state != CONNECT_DONE) {
        sx->state = CONNECT_DONE;
      }
      goto switchD_005d7c4f_caseD_2;
    }
    break;
  case CONNECT_REQ_INIT:
switchD_005d7c4f_caseD_9:
    sx->buffer[8] = '\0';
    pcVar24 = sx->proxy_user;
    if (pcVar24 == (char *)0x0) {
LAB_005d80a3:
      sVar15 = strlen((char *)(sx->buffer + 8));
      uVar16 = sVar15 + 9;
      if ((char)local_a8 == '\x06') {
        sx->buffer[4] = '\0';
        sx->buffer[5] = '\0';
        sx->buffer[6] = '\0';
        sx->buffer[7] = '\x01';
        local_98 = (connectdata *)sx->hostname;
        sVar15 = strlen((char *)local_98);
        if ((0xff < sVar15 + 1) || (uVar21 = sVar15 + 1 + uVar16, 599 < uVar21)) {
          pcVar24 = "SOCKS4: too long host name";
          goto LAB_005d81ea;
        }
        strcpy((char *)(puVar1 + uVar16),(char *)local_98);
        uVar16 = uVar21;
      }
      sx->outp = puVar1;
      sx->outstanding = uVar16;
      if (sx->state != CONNECT_REQ_SENDING) {
        sx->state = CONNECT_REQ_SENDING;
      }
      goto switchD_005d7c4f_caseD_e;
    }
    sVar15 = strlen(pcVar24);
    if (sVar15 < 0x100) {
      memcpy(sx->buffer + 8,pcVar24,sVar15 + 1);
      goto LAB_005d80a3;
    }
    pcVar24 = "Too long SOCKS proxy user name";
LAB_005d81d5:
    Curl_failf(data,pcVar24);
    CVar14 = CURLPX_LONG_USER;
    break;
  case CONNECT_RESOLVING:
    dns = Curl_fetch_addr(data,sx->hostname,pcVar3->port);
    if (dns == (Curl_dns_entry *)0x0) {
      CVar10 = Curl_resolv_check(data,&dns);
      pCVar25 = dns;
      if (dns == (Curl_dns_entry *)0x0) {
        CVar14 = CURLPX_RESOLVE_HOST;
        if (CVar10 == CURLE_OK) {
          CVar14 = CURLPX_OK;
        }
        break;
      }
    }
    else {
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data,"Hostname \'%s\' was found",sx->hostname);
      }
LAB_005d7ed0:
      if (sx->state != CONNECT_RESOLVED) {
        sx->state = CONNECT_RESOLVED;
      }
      pCVar25 = dns;
      if (dns == (Curl_dns_entry *)0x0) goto switchD_005d7c4f_caseD_b;
    }
    while (pCVar22 = pCVar25->addr, pCVar22 != (Curl_addrinfo *)0x0) {
      if (pCVar22->ai_family == 2) {
        Curl_printable_address(pCVar22,dest,0x40);
        psVar4 = pCVar22->ai_addr;
        sx->buffer[4] = psVar4->sa_data[2];
        sx->buffer[5] = psVar4->sa_data[3];
        sx->buffer[6] = psVar4->sa_data[4];
        sx->buffer[7] = psVar4->sa_data[5];
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(data,"SOCKS4 connect to IPv4 %s (locally resolved)",dest);
        }
        Curl_resolv_unlock(data,dns);
        goto switchD_005d7c4f_caseD_9;
      }
      pCVar25 = (Curl_dns_entry *)&pCVar22->ai_next;
    }
    pcVar24 = sx->hostname;
    pcVar23 = "SOCKS4 connection to %s not supported";
    goto LAB_005d7ff5;
  case CONNECT_RESOLVED:
switchD_005d7c4f_caseD_b:
    pcVar24 = sx->hostname;
    pcVar23 = "Failed to resolve \"%s\" for SOCKS4 connect.";
LAB_005d7ff5:
    Curl_failf(data,pcVar23,pcVar24);
LAB_005d7fff:
    CVar14 = CURLPX_RESOLVE_HOST;
    break;
  case CONNECT_REQ_SENDING:
switchD_005d7c4f_caseD_e:
    CVar14 = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"SOCKS4 connect request");
    if (CVar14 == CURLPX_OK) {
      if (sx->outstanding != 0) goto LAB_005d8b87;
      sx->outstanding = 8;
      sx->outp = puVar1;
      if (sx->state != CONNECT_SOCKS_READ) {
        sx->state = CONNECT_SOCKS_READ;
      }
      goto switchD_005d7c4f_caseD_4;
    }
  }
LAB_005d8ba3:
  if (CVar14 == CURLPX_OK) {
    CVar10 = CURLE_OK;
    if (sx->state == CONNECT_DONE) {
      cf->field_0x24 = cf->field_0x24 | 1;
      Curl_verboseconnect(data,conn);
      if (cf->ctx != (void *)0x0) {
        (*Curl_cfree)(cf->ctx);
        cf->ctx = (void *)0x0;
      }
    }
  }
  else {
    (data->info).pxcode = CVar14;
    CVar10 = CURLE_PROXY;
  }
LAB_005d8bb2:
  _Var8 = (_Bool)(cf->field_0x24 & 1);
LAB_005d7bc7:
  *done = _Var8;
  return CVar10;
}

Assistant:

static CURLcode socks_proxy_cf_connect(struct Curl_cfilter *cf,
                                       struct Curl_easy *data,
                                       bool blocking, bool *done)
{
  CURLcode result;
  struct connectdata *conn = cf->conn;
  int sockindex = cf->sockindex;
  struct socks_state *sx = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  if(!sx) {
    sx = calloc(1, sizeof(*sx));
    if(!sx)
      return CURLE_OUT_OF_MEMORY;
    cf->ctx = sx;
  }

  if(sx->state == CONNECT_INIT) {
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    sxstate(sx, data, CONNECT_SOCKS_INIT);
    sx->hostname =
      conn->bits.httpproxy ?
      conn->http_proxy.host.name :
      conn->bits.conn_to_host ?
      conn->conn_to_host.name :
      sockindex == SECONDARYSOCKET ?
      conn->secondaryhostname : conn->host.name;
    sx->remote_port =
      conn->bits.httpproxy ? (int)conn->http_proxy.port :
      sockindex == SECONDARYSOCKET ? conn->secondary_port :
      conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
    sx->proxy_user = conn->socks_proxy.user;
    sx->proxy_password = conn->socks_proxy.passwd;
  }

  result = connect_SOCKS(cf, sx, data);
  if(!result && sx->state == CONNECT_DONE) {
    cf->connected = TRUE;
    Curl_verboseconnect(data, conn);
    socks_proxy_cf_free(cf);
  }

  *done = cf->connected;
  return result;
}